

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfont_p.h
# Opt level: O0

bool __thiscall QFontDef::operator<(QFontDef *this,QFontDef *other)

{
  float fVar1;
  long lVar2;
  compare_eq_result_container<QList<QString>,_QString> cVar3;
  bool bVar4;
  size_type_conflict sVar5;
  size_type_conflict sVar6;
  float *pfVar7;
  long in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  const_iterator jt;
  const_iterator it;
  QList<QString> *in_stack_ffffffffffffff88;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  QList<QString> *in_stack_ffffffffffffffa8;
  QList<QString> *in_stack_ffffffffffffffb0;
  bool local_21;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  if ((*(double *)(in_RDI + 0x58) != *(double *)(in_RSI + 0x58)) ||
     (NAN(*(double *)(in_RDI + 0x58)) || NAN(*(double *)(in_RSI + 0x58)))) {
    local_21 = *(double *)(in_RDI + 0x58) < *(double *)(in_RSI + 0x58);
  }
  else if (((uint)((ulong)*(undefined8 *)(in_RDI + 0x60) >> 0x28) & 0x3ff) ==
           ((uint)((ulong)*(undefined8 *)(in_RSI + 0x60) >> 0x28) & 0x3ff)) {
    if (((uint)(*(ulong *)(in_RDI + 0x60) >> 0x1c) & 3) ==
        ((uint)(*(ulong *)(in_RSI + 0x60) >> 0x1c) & 3)) {
      if (((uint)((ulong)*(undefined8 *)(in_RDI + 0x60) >> 0x10) & 0xfff) ==
          ((uint)((ulong)*(undefined8 *)(in_RSI + 0x60) >> 0x10) & 0xfff)) {
        if (((uint)((ulong)*(undefined8 *)(in_RDI + 0x60) >> 0x20) & 0xff) ==
            ((uint)((ulong)*(undefined8 *)(in_RSI + 0x60) >> 0x20) & 0xff)) {
          if (((uint)*(undefined8 *)(in_RDI + 0x60) & 0xffff) ==
              ((uint)*(undefined8 *)(in_RSI + 0x60) & 0xffff)) {
            cVar3 = QList<QString>::operator!=
                              ((QList<QString> *)
                               CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
                               in_stack_ffffffffffffff88);
            if (cVar3) {
              local_21 = QList<QString>::operator<
                                   (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
            }
            else {
              bVar4 = ::operator!=((QString *)
                                   CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
                                   (QString *)in_stack_ffffffffffffff88);
              if (bVar4) {
                local_21 = ::operator<((QString *)
                                       CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90)
                                       ,(QString *)in_stack_ffffffffffffff88);
              }
              else if (((uint)(*(ulong *)(in_RDI + 0x60) >> 0x1e) & 3) ==
                       ((uint)(*(ulong *)(in_RSI + 0x60) >> 0x1e) & 3)) {
                if (((uint)((ulong)*(undefined8 *)(in_RDI + 0x60) >> 0x33) & 1) ==
                    ((uint)((ulong)*(undefined8 *)(in_RSI + 0x60) >> 0x33) & 1)) {
                  if (((uint)((ulong)*(undefined8 *)(in_RDI + 0x60) >> 0x32) & 1) ==
                      ((uint)((ulong)*(undefined8 *)(in_RSI + 0x60) >> 0x32) & 1)) {
                    bVar4 = operator!=<QFont::Tag,_float,_true>
                                      ((QMap<QFont::Tag,_float> *)
                                       CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90)
                                       ,(QMap<QFont::Tag,_float> *)in_stack_ffffffffffffff88);
                    if (bVar4) {
                      sVar5 = QMap<QFont::Tag,_float>::size
                                        ((QMap<QFont::Tag,_float> *)
                                         CONCAT17(in_stack_ffffffffffffff97,
                                                  in_stack_ffffffffffffff90));
                      sVar6 = QMap<QFont::Tag,_float>::size
                                        ((QMap<QFont::Tag,_float> *)
                                         CONCAT17(in_stack_ffffffffffffff97,
                                                  in_stack_ffffffffffffff90));
                      if (sVar5 != sVar6) {
                        sVar5 = QMap<QFont::Tag,_float>::size
                                          ((QMap<QFont::Tag,_float> *)
                                           CONCAT17(in_stack_ffffffffffffff97,
                                                    in_stack_ffffffffffffff90));
                        sVar6 = QMap<QFont::Tag,_float>::size
                                          ((QMap<QFont::Tag,_float> *)
                                           CONCAT17(in_stack_ffffffffffffff97,
                                                    in_stack_ffffffffffffff90));
                        local_21 = sVar5 < sVar6;
                        goto LAB_0073688e;
                      }
                      QMap<QFont::Tag,_float>::constBegin
                                ((QMap<QFont::Tag,_float> *)in_stack_ffffffffffffff88);
                      QMap<QFont::Tag,_float>::constBegin
                                ((QMap<QFont::Tag,_float> *)in_stack_ffffffffffffff88);
                      while( true ) {
                        QMap<QFont::Tag,_float>::constEnd
                                  ((QMap<QFont::Tag,_float> *)in_stack_ffffffffffffff88);
                        bVar4 = ::operator!=((const_iterator *)
                                             CONCAT17(in_stack_ffffffffffffff97,
                                                      in_stack_ffffffffffffff90),
                                             (const_iterator *)in_stack_ffffffffffffff88);
                        if (!bVar4) break;
                        QMap<QFont::Tag,_float>::const_iterator::key((const_iterator *)0x7367b6);
                        QMap<QFont::Tag,_float>::const_iterator::key((const_iterator *)0x7367c5);
                        bVar4 = ::operator!=((Tag *)CONCAT17(in_stack_ffffffffffffff97,
                                                             in_stack_ffffffffffffff90),
                                             (Tag *)in_stack_ffffffffffffff88);
                        if (bVar4) {
                          QMap<QFont::Tag,_float>::const_iterator::key((const_iterator *)0x7367e2);
                          QMap<QFont::Tag,_float>::const_iterator::key((const_iterator *)0x7367f1);
                          local_21 = ::operator<((Tag *)CONCAT17(in_stack_ffffffffffffff97,
                                                                 in_stack_ffffffffffffff90),
                                                 (Tag *)in_stack_ffffffffffffff88);
                          goto LAB_0073688e;
                        }
                        pfVar7 = QMap<QFont::Tag,_float>::const_iterator::value
                                           ((const_iterator *)0x736813);
                        fVar1 = *pfVar7;
                        pfVar7 = QMap<QFont::Tag,_float>::const_iterator::value
                                           ((const_iterator *)0x736827);
                        if ((fVar1 != *pfVar7) || (NAN(fVar1) || NAN(*pfVar7))) {
                          pfVar7 = QMap<QFont::Tag,_float>::const_iterator::value
                                             ((const_iterator *)0x736840);
                          fVar1 = *pfVar7;
                          pfVar7 = QMap<QFont::Tag,_float>::const_iterator::value
                                             ((const_iterator *)0x736854);
                          local_21 = fVar1 < *pfVar7;
                          goto LAB_0073688e;
                        }
                        QMap<QFont::Tag,_float>::const_iterator::operator++
                                  ((const_iterator *)
                                   CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90));
                        QMap<QFont::Tag,_float>::const_iterator::operator++
                                  ((const_iterator *)
                                   CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90));
                      }
                    }
                    local_21 = false;
                  }
                  else {
                    local_21 = ((uint)((ulong)*(undefined8 *)(in_RDI + 0x60) >> 0x32) & 1) <
                               ((uint)((ulong)*(undefined8 *)(in_RSI + 0x60) >> 0x32) & 1);
                  }
                }
                else {
                  local_21 = ((uint)((ulong)*(undefined8 *)(in_RDI + 0x60) >> 0x33) & 1) <
                             ((uint)((ulong)*(undefined8 *)(in_RSI + 0x60) >> 0x33) & 1);
                }
              }
              else {
                local_21 = ((uint)(*(ulong *)(in_RDI + 0x60) >> 0x1e) & 3) <
                           ((uint)(*(ulong *)(in_RSI + 0x60) >> 0x1e) & 3);
              }
            }
          }
          else {
            local_21 = ((uint)*(undefined8 *)(in_RDI + 0x60) & 0xffff) <
                       ((uint)*(undefined8 *)(in_RSI + 0x60) & 0xffff);
          }
        }
        else {
          local_21 = ((uint)((ulong)*(undefined8 *)(in_RDI + 0x60) >> 0x20) & 0xff) <
                     ((uint)((ulong)*(undefined8 *)(in_RSI + 0x60) >> 0x20) & 0xff);
        }
      }
      else {
        local_21 = ((uint)((ulong)*(undefined8 *)(in_RDI + 0x60) >> 0x10) & 0xfff) <
                   ((uint)((ulong)*(undefined8 *)(in_RSI + 0x60) >> 0x10) & 0xfff);
      }
    }
    else {
      local_21 = ((uint)(*(ulong *)(in_RDI + 0x60) >> 0x1c) & 3) <
                 ((uint)(*(ulong *)(in_RSI + 0x60) >> 0x1c) & 3);
    }
  }
  else {
    local_21 = ((uint)((ulong)*(undefined8 *)(in_RDI + 0x60) >> 0x28) & 0x3ff) <
               ((uint)((ulong)*(undefined8 *)(in_RSI + 0x60) >> 0x28) & 0x3ff);
  }
LAB_0073688e:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return local_21;
}

Assistant:

inline bool operator<(const QFontDef &other) const
    {
        if (pixelSize != other.pixelSize) return pixelSize < other.pixelSize;
        if (weight != other.weight) return weight < other.weight;
        if (style != other.style) return style < other.style;
        if (stretch != other.stretch) return stretch < other.stretch;
        if (styleHint != other.styleHint) return styleHint < other.styleHint;
        if (styleStrategy != other.styleStrategy) return styleStrategy < other.styleStrategy;
        if (families != other.families) return families < other.families;
        if (styleName != other.styleName)
            return styleName < other.styleName;
        if (hintingPreference != other.hintingPreference) return hintingPreference < other.hintingPreference;


        if (ignorePitch != other.ignorePitch) return ignorePitch < other.ignorePitch;
        if (fixedPitch != other.fixedPitch) return fixedPitch < other.fixedPitch;
        if (variableAxisValues != other.variableAxisValues) {
            if (variableAxisValues.size() != other.variableAxisValues.size())
                return variableAxisValues.size() < other.variableAxisValues.size();

            {
                auto it = variableAxisValues.constBegin();
                auto jt = other.variableAxisValues.constBegin();
                for (; it != variableAxisValues.constEnd(); ++it, ++jt) {
                    if (it.key() != jt.key())
                        return jt.key() < it.key();
                    if (it.value() != jt.value())
                        return jt.value() < it.value();
                }
            }
        }

        return false;
    }